

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.c
# Opt level: O3

void rngStepR(void *buf,size_t count,void *state)

{
  err_t eVar1;
  size_t in_RAX;
  int *piVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  size_t local_38;
  
  local_38 = in_RAX;
  mtMtxLock(_mtx);
  if (count != 0) {
    piVar2 = &DAT_0015cbb4;
    uVar3 = 0;
    uVar4 = 0;
    do {
      eVar1 = rngESRead(&local_38,(void *)((long)buf + uVar3),count - uVar3,
                        (char *)((long)&DAT_0015cbb4 + (long)*piVar2));
      if (eVar1 != 0) {
        local_38 = 0;
      }
      uVar3 = uVar3 + local_38;
      if (count <= uVar3) break;
      piVar2 = piVar2 + 1;
      bVar5 = uVar4 < 4;
      uVar4 = uVar4 + 1;
    } while (bVar5);
  }
  brngCTRStepR(buf,count,_state + 1);
  mtMtxUnlock(_mtx);
  return;
}

Assistant:

void rngStepR(void* buf, size_t count, void* state)
{
	const char* sources[] = {"trng", "trng2", "sys", "sys2", "timer"};
	size_t read, r, pos;
	// блокировать мьютекс
	ASSERT(_inited);
	mtMtxLock(_mtx);
	// опросить источники
	read = pos = 0;
	while (read < count && pos < COUNT_OF(sources))
	{
		if (rngESRead(&r, (octet*)buf + read, count - read,
				sources[pos]) != ERR_OK)
			r = 0;
		read += r, ++pos;
	}
	read = r = pos = 0;
	// генерация
	ASSERT(rngIsValid_internal());
	brngCTRStepR(buf, count, _state->alg_state);
	// снять блокировку
	mtMtxUnlock(_mtx);
}